

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O2

int fffi8s1(LONGLONG *input,long ntodo,double scale,double zero,int nullcheck,LONGLONG tnull,
           char nullval,char *nullarray,int *anynull,char *output,int *status)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 9.223372036854776e+18) {
      lVar4 = 0;
      if (0 < ntodo) {
        lVar4 = ntodo;
      }
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
          dVar5 = (double)input[lVar2] * scale + zero;
          if (-128.49 <= dVar5) {
            if (dVar5 <= 127.49) {
              cVar1 = (char)(int)dVar5;
            }
            else {
              *status = -0xb;
              cVar1 = '\x7f';
            }
          }
          else {
            *status = -0xb;
            cVar1 = -0x80;
          }
          output[lVar2] = cVar1;
        }
      }
      else {
        for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
          lVar3 = input[lVar2];
          if (lVar3 < -0x80) {
            *status = -0xb;
            lVar3 = 0x80;
          }
          else if (0x7f < lVar3) {
            *status = -0xb;
            lVar3 = 0x7f;
          }
          output[lVar2] = (char)lVar3;
        }
      }
    }
    else {
      lVar4 = 0;
      if (ntodo < 1) {
        ntodo = lVar4;
      }
      for (; ntodo != lVar4; lVar4 = lVar4 + 1) {
        lVar2 = input[lVar4];
        if (-0x7fffffffffffff81 < lVar2) {
          *status = -0xb;
          lVar2 = 0x7f;
        }
        output[lVar4] = (char)lVar2;
      }
    }
  }
  else if (scale != 1.0 || zero != 9.223372036854776e+18) {
    lVar4 = 0;
    if (0 < ntodo) {
      lVar4 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          dVar5 = (double)input[lVar2] * scale + zero;
          if (-128.49 <= dVar5) {
            if (dVar5 <= 127.49) {
              output[lVar2] = (char)(int)dVar5;
            }
            else {
              *status = -0xb;
              output[lVar2] = '\x7f';
            }
          }
          else {
            *status = -0xb;
            output[lVar2] = -0x80;
          }
        }
      }
    }
    else {
      for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
        lVar3 = input[lVar2];
        if (lVar3 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else if (lVar3 < -0x80) {
          *status = -0xb;
          output[lVar2] = -0x80;
        }
        else if (lVar3 < 0x80) {
          output[lVar2] = (char)lVar3;
        }
        else {
          *status = -0xb;
          output[lVar2] = '\x7f';
        }
      }
    }
  }
  else {
    lVar4 = 0;
    if (ntodo < 1) {
      ntodo = lVar4;
    }
    for (; ntodo != lVar4; lVar4 = lVar4 + 1) {
      lVar2 = input[lVar4];
      if (lVar2 == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar4] = nullval;
        }
        else {
          nullarray[lVar4] = '\x01';
        }
      }
      else if (lVar2 < -0x7fffffffffffff80) {
        output[lVar4] = (char)lVar2;
      }
      else {
        *status = -0xb;
        output[lVar4] = '\x7f';
      }
    }
  }
  return *status;
}

Assistant:

int fffi8s1(LONGLONG *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            LONGLONG tnull,       /* I - value of FITS TNULLn keyword if any */
            signed char nullval,  /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            signed char *output,  /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    ULONGLONG ulltemp;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                if (ulltemp > 127)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
		{
                    output[ii] = (short) ulltemp;
		}
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < -128)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (input[ii] > 127)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (dvalue > DSCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of subtracting 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
		{
                    ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                    if (ulltemp > 127)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
		    {
                        output[ii] = (short) ulltemp;
		    }
                }
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (input[ii] < -128)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (input[ii] > 127)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (dvalue > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) dvalue;
                }
            }
        }
    }
    return(*status);
}